

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::NotifyHeaderTip(ChainstateManager *this)

{
  long lVar1;
  SynchronizationState SVar2;
  Notifications *pNVar3;
  long in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindexHeader;
  bool fInitialBlockDownload;
  ChainstateManager *in_stack_00000040;
  bool fNotify;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  undefined2 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  long lVar4;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 uVar5;
  byte bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = 0;
  uVar5 = 0;
  mutexIn = (AnnotatedMixin<std::recursive_mutex> *)0x0;
  GetMutex((ChainstateManager *)
           CONCAT44(in_stack_ffffffffffffff9c,
                    CONCAT13(in_stack_ffffffffffffff9b,
                             CONCAT12(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98))));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff9c,
                      CONCAT13(in_stack_ffffffffffffff9b,
                               CONCAT12(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98))));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(bVar6,CONCAT16(uVar5,in_stack_ffffffffffffffd8)),mutexIn,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  lVar4 = *(long *)(in_RDI + 0xce8);
  if (lVar4 != *(long *)(in_RDI + 0x20)) {
    bVar6 = 1;
    in_stack_ffffffffffffffb7 = IsInitialBlockDownload(in_stack_00000040);
    *(long *)(in_RDI + 0x20) = lVar4;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,
                      CONCAT13(in_stack_ffffffffffffff9b,
                               CONCAT12(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98))));
  if ((bVar6 & 1) != 0) {
    pNVar3 = GetNotifications((ChainstateManager *)
                              CONCAT44(in_stack_ffffffffffffff9c,
                                       CONCAT13(in_stack_ffffffffffffff9b,
                                                CONCAT12(in_stack_ffffffffffffff9a,
                                                         in_stack_ffffffffffffff98))));
    std::atomic::operator_cast_to_bool
              ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    SVar2 = GetSynchronizationState((bool)in_stack_ffffffffffffff9b,(bool)in_stack_ffffffffffffff9a)
    ;
    (*pNVar3->_vptr_Notifications[3])
              (pNVar3,(ulong)SVar2,(long)*(int *)(lVar4 + 0x18),(ulong)*(uint *)(lVar4 + 0x80),0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::NotifyHeaderTip()
{
    bool fNotify = false;
    bool fInitialBlockDownload = false;
    CBlockIndex* pindexHeader = nullptr;
    {
        LOCK(GetMutex());
        pindexHeader = m_best_header;

        if (pindexHeader != m_last_notified_header) {
            fNotify = true;
            fInitialBlockDownload = IsInitialBlockDownload();
            m_last_notified_header = pindexHeader;
        }
    }
    // Send block tip changed notifications without the lock held
    if (fNotify) {
        GetNotifications().headerTip(GetSynchronizationState(fInitialBlockDownload, m_blockman.m_blockfiles_indexed), pindexHeader->nHeight, pindexHeader->nTime, false);
    }
    return fNotify;
}